

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O1

void __thiscall
StatisticsWriter::writeHistogram<double>
          (StatisticsWriter *this,ostream *stream,string *title,DynamicHistogram<double> *histogram)

{
  long lVar1;
  double dVar2;
  pointer pdVar3;
  pointer pdVar4;
  undefined8 uVar5;
  pointer pdVar6;
  char cVar7;
  ios iVar8;
  long *width;
  long lVar9;
  ostream *poVar10;
  int iVar11;
  ulong uVar12;
  pointer pdVar13;
  ulong uVar14;
  ulong uVar15;
  ios *this_00;
  ulong uVar16;
  ulong uVar17;
  string entry;
  double d;
  string indent;
  string header;
  string footer;
  stringstream parser;
  char *local_390;
  long local_388;
  char local_380;
  undefined1 uStack_37f;
  undefined1 uStack_37e;
  undefined1 uStack_37d;
  undefined4 uStack_37c;
  pointer local_370;
  pointer local_368;
  pointer local_360;
  pointer local_358;
  pointer local_350;
  double local_348;
  double local_340;
  ios_base *local_338;
  pointer local_330;
  pointer local_328;
  pointer local_320;
  uint local_314;
  long *local_310;
  long *local_308;
  long *local_300;
  long *local_2f8;
  long *local_2f0;
  long *local_2e8;
  long local_2e0;
  long local_2d8 [2];
  long *local_2c8;
  long local_2c0;
  long local_2b8 [2];
  ulong local_2a8;
  long *local_2a0 [2];
  long local_290 [2];
  string *local_280;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [16];
  pointer local_1a8;
  uint auStack_190 [22];
  ios_base aiStack_138 [264];
  
  local_338 = (ios_base *)this;
  local_280 = title;
  width = (long *)operator_new(0x30);
  width[4] = 0;
  width[5] = 0;
  width[2] = 0;
  width[3] = 0;
  *width = 0;
  width[1] = 0;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"Bin Min","");
  StringParser::updateWidthString(&local_1d8,width);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"Bin Max","");
  local_2f0 = width + 1;
  StringParser::updateWidthString(&local_1f8,local_2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Center","");
  local_2f8 = width + 2;
  StringParser::updateWidthString(&local_218,local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Frequency","");
  local_300 = width + 3;
  StringParser::updateWidthString(&local_238,local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"PDF","");
  local_308 = width + 4;
  StringParser::updateWidthString(&local_258,local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"CDF","");
  local_310 = width + 5;
  StringParser::updateWidthString(&local_278,local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_314 = DynamicHistogram<double>::count(histogram);
  DynamicHistogram<double>::frequencies
            ((vector<double,_std::allocator<double>_> *)local_1b8,histogram);
  uVar5 = local_1b8._0_8_;
  local_320 = (pointer)local_1b8._8_8_;
  local_368 = local_1a8;
  DynamicHistogram<double>::pdf((vector<double,_std::allocator<double>_> *)local_1b8,histogram);
  local_358 = (pointer)uVar5;
  local_360 = (pointer)local_1b8._0_8_;
  local_328 = (pointer)local_1b8._8_8_;
  local_370 = local_1a8;
  DynamicHistogram<double>::cdf((vector<double,_std::allocator<double>_> *)local_1b8,histogram);
  pdVar6 = local_1a8;
  local_350 = (pointer)local_1b8._0_8_;
  local_330 = (pointer)local_1b8._8_8_;
  local_2a8 = (ulong)local_314;
  if (local_314 != 0) {
    uVar16 = (long)local_320 - (long)local_358 >> 3;
    uVar15 = (long)local_328 - (long)local_360 >> 3;
    uVar14 = (long)(local_1b8._8_8_ - local_1b8._0_8_) >> 3;
    uVar12 = 0;
    do {
      StringParser::updateWidthNumber<long>(uVar12,width);
      iVar11 = (int)uVar12;
      local_340 = DynamicHistogram<double>::bin(histogram,iVar11);
      dVar2 = DynamicHistogram<double>::width(histogram,iVar11);
      StringParser::updateWidthNumber<double>(local_340 + dVar2 * -0.5,local_2f0);
      local_340 = DynamicHistogram<double>::bin(histogram,iVar11);
      dVar2 = DynamicHistogram<double>::width(histogram,iVar11);
      StringParser::updateWidthNumber<double>(local_340 + dVar2 * 0.5,local_2f8);
      uVar17 = uVar16;
      if (((uVar16 <= uVar12) ||
          (StringParser::updateWidthNumber<long_long>((long)local_358[uVar12],local_300),
          uVar17 = uVar15, uVar15 <= uVar12)) ||
         (StringParser::updateWidthNumber<double>(local_360[uVar12],local_308), uVar17 = uVar14,
         uVar14 <= uVar12)) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar12,uVar17);
      }
      StringParser::updateWidthNumber<double>(local_350[uVar12],local_310);
      uVar12 = uVar12 + 1;
    } while ((int)local_2a8 != (int)uVar12);
  }
  uVar12 = 0;
  lVar9 = 0;
  do {
    lVar1 = *(long *)((long)width + lVar9);
    *(long *)((long)width + lVar9) = lVar1 + 3;
    uVar12 = uVar12 + lVar1 + 3;
    lVar9 = lVar9 + 8;
  } while (lVar9 != 0x30);
  local_2c8 = local_2b8;
  std::__cxx11::string::_M_construct((string *)&local_2c8,uVar12,'=');
  local_2a0[0] = local_290;
  std::__cxx11::string::_M_construct((string *)local_2a0,uVar12,'-');
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)stream,*(char **)local_338,*(long *)(local_338 + 8));
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_2c8,local_2c0);
  cVar7 = std::ios::widen((ios *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18)),'\n');
  poVar10 = (ostream *)std::ostream::put(poVar10,cVar7);
  std::ostream::flush(poVar10);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)stream,*(char **)local_338,*(long *)(local_338 + 8));
  this_00 = (ios *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18));
  if (poVar10[*(long *)(*(long *)poVar10 + -0x18) + 0xe1] == (ostream)0x0) {
    iVar8 = (ios)std::ios::widen(this_00,' ');
    this_00[0xe0] = iVar8;
    this_00[0xe1] = (ios)0x1;
  }
  this_00[0xe0] = (ios)0x20;
  *(long *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x10) =
       (long)(int)(uVar12 - ((long)uVar12 >> 0x3f) >> 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Histogram of ",0xd);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,(local_280->_M_dataplus)._M_p,local_280->_M_string_length);
  cVar7 = std::ios::widen((ios *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18)),'\n');
  poVar10 = (ostream *)std::ostream::put(poVar10,cVar7);
  std::ostream::flush(poVar10);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)stream,*(char **)local_338,*(long *)(local_338 + 8));
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_2c8,local_2c0);
  cVar7 = std::ios::widen((ios *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18)),'\n');
  poVar10 = (ostream *)std::ostream::put(poVar10,cVar7);
  std::ostream::flush(poVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)stream,*(char **)local_338,*(long *)(local_338 + 8));
  lVar9 = *(long *)stream;
  lVar1 = *(long *)(lVar9 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)*width;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"Bin",3);
  lVar9 = *(long *)stream;
  lVar1 = *(long *)(lVar9 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)*local_2f0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"Min",3);
  lVar9 = *(long *)stream;
  lVar1 = *(long *)(lVar9 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)*local_2f8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"Max",3);
  lVar9 = *(long *)stream;
  lVar1 = *(long *)(lVar9 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)*local_300;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"Frequency",9);
  lVar9 = *(long *)stream;
  lVar1 = *(long *)(lVar9 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)*local_308;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"PDF",3);
  lVar9 = *(long *)stream;
  lVar1 = *(long *)(lVar9 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)*local_310;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"CDF",3);
  cVar7 = std::ios::widen((ios *)(stream + *(long *)(*(long *)stream + -0x18)),'\n');
  poVar10 = (ostream *)std::ostream::put((ostream *)stream,cVar7);
  std::ostream::flush(poVar10);
  local_2e8 = local_2d8;
  std::__cxx11::string::_M_construct((string *)&local_2e8,*(ulong *)(local_338 + 8),' ');
  if (local_314 != 0) {
    local_338 = aiStack_138;
    local_320 = (pointer)((long)local_320 - (long)local_358 >> 3);
    local_328 = (pointer)((long)local_328 - (long)local_360 >> 3);
    local_330 = (pointer)((long)local_330 - (long)local_350 >> 3);
    pdVar13 = (pointer)0x0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)stream,(char *)local_2e8,local_2e0);
      lVar9 = *(long *)stream;
      lVar1 = *(long *)(lVar9 + -0x18);
      *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
      *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)*width;
      iVar11 = (int)pdVar13;
      local_348 = (double)((ulong)pdVar13 & 0xffffffff);
      local_390 = &local_380;
      if (NAN(local_348)) {
        uStack_37e = 0x6e;
        local_380 = 'n';
        uStack_37f = 0x61;
        local_388 = 3;
        uStack_37d = 0;
      }
      else {
        local_388 = 0;
        local_380 = '\0';
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        *(uint *)((long)auStack_190 + (long)local_1a8[-3]) =
             *(uint *)((long)auStack_190 + (long)local_1a8[-3]) & 0xfffffefb | 4;
        std::ostream::_M_insert<long>((ostream *)&local_1a8,(long)pdVar13);
        std::operator>>((istream *)local_1b8,(string *)&local_390);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_338);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,local_390,local_388);
      if (local_390 != &local_380) {
        operator_delete(local_390,
                        CONCAT44(uStack_37c,
                                 CONCAT13(uStack_37d,
                                          CONCAT12(uStack_37e,CONCAT11(uStack_37f,local_380)))) + 1)
        ;
      }
      lVar9 = *(long *)stream;
      lVar1 = *(long *)(lVar9 + -0x18);
      *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
      *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)*local_2f0;
      local_340 = DynamicHistogram<double>::bin(histogram,iVar11);
      dVar2 = DynamicHistogram<double>::width(histogram,iVar11);
      local_348 = local_340 + dVar2 * -0.5;
      if (NAN(local_348)) {
        uStack_37e = 0x6e;
        local_380 = 'n';
        uStack_37f = 0x61;
        local_388 = 3;
        uStack_37d = 0;
        local_390 = &local_380;
      }
      else {
        local_388 = 0;
        local_380 = '\0';
        local_390 = &local_380;
        local_340 = local_348;
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        *(uint *)((long)auStack_190 + (long)local_1a8[-3]) =
             *(uint *)((long)auStack_190 + (long)local_1a8[-3]) & 0xfffffefb | 4;
        std::ostream::_M_insert<double>((ostream *)&local_1a8,local_340);
        std::operator>>((istream *)local_1b8,(string *)&local_390);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_338);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,local_390,local_388);
      if (local_390 != &local_380) {
        operator_delete(local_390,
                        CONCAT44(uStack_37c,
                                 CONCAT13(uStack_37d,
                                          CONCAT12(uStack_37e,CONCAT11(uStack_37f,local_380)))) + 1)
        ;
      }
      lVar9 = *(long *)stream;
      lVar1 = *(long *)(lVar9 + -0x18);
      *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
      *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)*local_2f8;
      local_340 = DynamicHistogram<double>::bin(histogram,iVar11);
      dVar2 = DynamicHistogram<double>::width(histogram,iVar11);
      local_348 = local_340 + dVar2 * 0.5;
      if (NAN(local_348)) {
        uStack_37e = 0x6e;
        local_380 = 'n';
        uStack_37f = 0x61;
        local_388 = 3;
        uStack_37d = 0;
        local_390 = &local_380;
      }
      else {
        local_388 = 0;
        local_380 = '\0';
        local_390 = &local_380;
        local_340 = local_348;
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        *(uint *)((long)auStack_190 + (long)local_1a8[-3]) =
             *(uint *)((long)auStack_190 + (long)local_1a8[-3]) & 0xfffffefb | 4;
        std::ostream::_M_insert<double>((ostream *)&local_1a8,local_340);
        std::operator>>((istream *)local_1b8,(string *)&local_390);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_338);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,local_390,local_388);
      if (local_390 != &local_380) {
        operator_delete(local_390,
                        CONCAT44(uStack_37c,
                                 CONCAT13(uStack_37d,
                                          CONCAT12(uStack_37e,CONCAT11(uStack_37f,local_380)))) + 1)
        ;
      }
      lVar9 = *(long *)stream;
      lVar1 = *(long *)(lVar9 + -0x18);
      *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
      *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)*local_300;
      if (local_320 <= pdVar13) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   pdVar13,local_320);
      }
      dVar2 = local_358[(long)pdVar13];
      local_348 = (double)(long)dVar2;
      if (NAN(local_348)) {
        uStack_37e = 0x6e;
        local_380 = 'n';
        uStack_37f = 0x61;
        local_388 = 3;
        uStack_37d = 0;
        local_390 = &local_380;
      }
      else {
        local_388 = 0;
        local_380 = '\0';
        local_390 = &local_380;
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        *(uint *)((long)auStack_190 + (long)local_1a8[-3]) =
             *(uint *)((long)auStack_190 + (long)local_1a8[-3]) & 0xfffffefb | 4;
        std::ostream::_M_insert<long_long>((ostream *)&local_1a8,(long)dVar2);
        std::operator>>((istream *)local_1b8,(string *)&local_390);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_338);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,local_390,local_388);
      if (local_390 != &local_380) {
        operator_delete(local_390,
                        CONCAT44(uStack_37c,
                                 CONCAT13(uStack_37d,
                                          CONCAT12(uStack_37e,CONCAT11(uStack_37f,local_380)))) + 1)
        ;
      }
      lVar9 = *(long *)stream;
      lVar1 = *(long *)(lVar9 + -0x18);
      *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
      *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)*local_308;
      if (local_328 <= pdVar13) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   pdVar13,local_328);
      }
      local_348 = local_360[(long)pdVar13];
      if (NAN(local_348)) {
        uStack_37e = 0x6e;
        local_380 = 'n';
        uStack_37f = 0x61;
        local_388 = 3;
        uStack_37d = 0;
        local_390 = &local_380;
      }
      else {
        local_388 = 0;
        local_380 = '\0';
        local_390 = &local_380;
        local_340 = local_348;
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        *(uint *)((long)auStack_190 + (long)local_1a8[-3]) =
             *(uint *)((long)auStack_190 + (long)local_1a8[-3]) & 0xfffffefb | 4;
        std::ostream::_M_insert<double>((ostream *)&local_1a8,local_340);
        std::operator>>((istream *)local_1b8,(string *)&local_390);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_338);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,local_390,local_388);
      if (local_390 != &local_380) {
        operator_delete(local_390,
                        CONCAT44(uStack_37c,
                                 CONCAT13(uStack_37d,
                                          CONCAT12(uStack_37e,CONCAT11(uStack_37f,local_380)))) + 1)
        ;
      }
      lVar9 = *(long *)stream;
      lVar1 = *(long *)(lVar9 + -0x18);
      *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
      *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)*local_310;
      if (local_330 <= pdVar13) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   pdVar13,local_330);
      }
      local_348 = local_350[(long)pdVar13];
      if (NAN(local_348)) {
        uStack_37e = 0x6e;
        local_380 = 'n';
        uStack_37f = 0x61;
        local_388 = 3;
        uStack_37d = 0;
        local_390 = &local_380;
      }
      else {
        local_388 = 0;
        local_380 = '\0';
        local_390 = &local_380;
        local_340 = local_348;
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        *(uint *)((long)auStack_190 + (long)local_1a8[-3]) =
             *(uint *)((long)auStack_190 + (long)local_1a8[-3]) & 0xfffffefb | 4;
        std::ostream::_M_insert<double>((ostream *)&local_1a8,local_340);
        std::operator>>((istream *)local_1b8,(string *)&local_390);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_338);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,local_390,local_388);
      if (local_390 != &local_380) {
        operator_delete(local_390,
                        CONCAT44(uStack_37c,
                                 CONCAT13(uStack_37d,
                                          CONCAT12(uStack_37e,CONCAT11(uStack_37f,local_380)))) + 1)
        ;
      }
      cVar7 = std::ios::widen((ios *)(stream + *(long *)(*(long *)stream + -0x18)),'\n');
      poVar10 = (ostream *)std::ostream::put((ostream *)stream,cVar7);
      std::ostream::flush(poVar10);
      pdVar13 = (pointer)((long)pdVar13 + 1);
    } while ((int)local_2a8 != (int)pdVar13);
  }
  if (local_2e8 != local_2d8) {
    operator_delete(local_2e8,local_2d8[0] + 1);
  }
  pdVar4 = local_350;
  pdVar3 = local_358;
  pdVar13 = local_360;
  if (local_2a0[0] != local_290) {
    operator_delete(local_2a0[0],local_290[0] + 1);
  }
  if (local_2c8 != local_2b8) {
    operator_delete(local_2c8,local_2b8[0] + 1);
  }
  operator_delete(width,0x30);
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4,(long)pdVar6 - (long)pdVar4);
  }
  if (pdVar13 != (pointer)0x0) {
    operator_delete(pdVar13,(long)local_370 - (long)pdVar13);
  }
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3,(long)local_368 - (long)pdVar3);
  }
  cVar7 = std::ios::widen((ios *)(stream + *(long *)(*(long *)stream + -0x18)),'\n');
  poVar10 = (ostream *)std::ostream::put((ostream *)stream,cVar7);
  std::ostream::flush(poVar10);
  return;
}

Assistant:

void
    writeHistogram(std::ostream & stream,
                   std::string const & title,
                   DynamicHistogram<T> & histogram)
    {

        try
        {

            unsigned int nBins = 0;
            std::vector<double> freq;
            std::vector<double> pdf;
            std::vector<double> cdf;

            // Compute column widths
            std::vector<long> width(6,0);
            StringParser::updateWidthString("Bin Min", width[0]);
            StringParser::updateWidthString("Bin Max", width[1]);
            StringParser::updateWidthString("Center", width[2]);
            StringParser::updateWidthString("Frequency", width[3]);
            StringParser::updateWidthString("PDF", width[4]);
            StringParser::updateWidthString("CDF", width[5]);

            nBins = histogram.count();
            freq = histogram.frequencies();
            pdf = histogram.pdf();
            cdf = histogram.cdf();
            for (unsigned int i = 0; i < nBins; i++)
            {
                StringParser::updateWidthNumber<long>(i, width[0]);
                StringParser::updateWidthNumber<double>(histogram.bin(i)-histogram.width(i)/2, width[1]);
                StringParser::updateWidthNumber<double>(histogram.bin(i)+histogram.width(i)/2, width[2]);
                StringParser::updateWidthNumber<long long>((long long)freq.at(i), width[3]);
                StringParser::updateWidthNumber<double>(pdf.at(i), width[4]);
                StringParser::updateWidthNumber<double>(cdf.at(i), width[5]);
            }

            long totalWidth = 0;
            for (std::vector<long>::iterator it = width.begin(); it != width.end(); ++it)
            {
                (*it) += 3;
                totalWidth += *it;
            }

            // Print data headers
            std::string header(totalWidth,'=');
            std::string footer(totalWidth,'-');
            stream << this->_comment << header << std::endl;
            stream << this->_comment << std::setfill (' ') << std::setw (totalWidth/2) << "Histogram of " << title << std::endl;
            stream << this->_comment << header << std::endl;
            stream << this->_comment;
            stream << std::right << std::setw(width[0]) << "Bin"
                   << std::right << std::setw(width[1]) << "Min"
                   << std::right << std::setw(width[2]) << "Max"
                   << std::right << std::setw(width[3]) << "Frequency"
                   << std::right << std::setw(width[4]) << "PDF"
                   << std::right << std::setw(width[5]) << "CDF"
                   << std::endl;

            // Print data
            std::string indent(this->_comment.size(), ' ');
            for (unsigned int i = 0; i < nBins; i++)
            {
                stream << indent;
                stream << std::right << std::setw(width[0]) << StringParser::parseNumber<long>(i);
                stream << std::right << std::setw(width[1]) << StringParser::parseNumber<double>(histogram.bin(i)-histogram.width(i)/2);
                stream << std::right << std::setw(width[2]) << StringParser::parseNumber<double>(histogram.bin(i)+histogram.width(i)/2);
                stream << std::right << std::setw(width[3]) << StringParser::parseNumber<long long>((long long)freq.at(i));
                stream << std::right << std::setw(width[4]) << StringParser::parseNumber<double>(pdf.at(i));
                stream << std::right << std::setw(width[5]) << StringParser::parseNumber<double>(cdf.at(i));
                stream << std::endl;
            }

        }
        catch (...)
        {
            stream << "No valid data" << std::endl;
        }
        stream << std::endl;

        return;
    }